

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxIn_EstimateTxInSize_Test::TestBody(ConfidentialTxIn_EstimateTxInSize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  bool bVar1;
  int iVar2;
  Script *scriptsig_template;
  long lVar3;
  char *pcVar4;
  pointer pTVar5;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  AssertHelper local_b68;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b50;
  uint32_t cache_size;
  uint32_t wit_size;
  uint32_t size;
  AssertHelper local_b30;
  pointer local_b28;
  Script local_b20;
  Script script_template;
  Script local_a98;
  undefined2 local_a60;
  bool local_a5e;
  _Alloc_hider local_a58;
  char local_a48 [16];
  undefined8 local_a38;
  uint32_t local_a30;
  undefined8 local_a28;
  undefined4 local_a20;
  Script local_a18;
  undefined4 local_9e0;
  Script local_9d8;
  undefined2 local_9a0;
  undefined1 local_99e;
  undefined1 *local_998 [2];
  undefined1 local_988 [16];
  undefined8 local_978;
  undefined4 local_970;
  undefined8 local_968;
  undefined4 local_960;
  Script local_958;
  undefined4 local_920;
  Script local_918;
  undefined2 local_8e0;
  undefined1 local_8de;
  undefined1 *local_8d8 [2];
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined4 local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  Script local_898;
  undefined4 local_860;
  Script local_858;
  undefined2 local_820;
  undefined1 local_81e;
  undefined1 *local_818 [2];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined4 local_7f0;
  undefined8 local_7e8;
  undefined4 local_7e0;
  Script local_7d8;
  undefined4 local_7a0;
  Script local_798;
  undefined2 local_760;
  undefined1 local_75e;
  undefined1 *local_758 [2];
  undefined1 local_748 [16];
  undefined8 local_738;
  undefined4 local_730;
  undefined8 local_728;
  undefined4 local_720;
  Script local_718;
  undefined4 local_6e0;
  Script local_6d8;
  undefined2 local_6a0;
  undefined1 local_69e;
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  undefined8 local_678;
  undefined4 local_670;
  undefined8 local_668;
  undefined4 local_660;
  Script local_658;
  undefined4 local_620;
  Script local_618;
  undefined2 local_5e0;
  undefined1 local_5de;
  undefined1 *local_5d8 [2];
  undefined1 local_5c8 [16];
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined8 local_5a8;
  undefined4 local_5a0;
  Script local_598;
  undefined4 local_560;
  Script local_558;
  undefined2 local_520;
  undefined1 local_51e;
  undefined1 *local_518 [2];
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  Script local_4d8;
  undefined4 local_4a0;
  Script local_498;
  undefined2 local_460;
  undefined1 local_45e;
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined8 local_438;
  undefined4 local_430;
  undefined8 local_428;
  undefined4 local_420;
  Script local_418;
  undefined4 local_3e0;
  Script local_3d8;
  undefined2 local_3a0;
  undefined1 local_39e;
  undefined1 *local_398 [2];
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined4 local_370;
  undefined8 local_368;
  undefined4 local_360;
  Script local_358;
  undefined4 local_320;
  Script local_318;
  undefined2 local_2e0;
  undefined1 local_2de;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  Script local_298;
  undefined4 local_260;
  Script local_258;
  undefined2 local_220;
  undefined1 local_21e;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  Script local_1d8;
  undefined4 local_1a0;
  Script local_198;
  undefined2 local_160;
  undefined1 local_15e;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  Script local_118;
  undefined4 local_e0;
  Script local_d8;
  undefined2 local_a0;
  undefined1 local_9e;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined4 local_70;
  Script local_68;
  
  if (TestBody()::multisig_script_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_);
    if (iVar2 != 0) {
      TestBody()::multisig_script_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::multisig_script_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::multisig_script_abi_cxx11_,
                 "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
    }
  }
  if (TestBody()::scriptsig_template_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::scriptsig_template_abi_cxx11_);
    if (iVar2 != 0) {
      TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::scriptsig_template_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::scriptsig_template_abi_cxx11_,
                 "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::scriptsig_template_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::scriptsig_template_abi_cxx11_);
    }
  }
  if (TestBody()::test_vector == '\0') {
    iVar2 = __cxa_guard_acquire(&TestBody()::test_vector);
    if (iVar2 != 0) {
      script_template._vptr_Script = (_func_int **)0x9600000002;
      script_template.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      cfd::core::Script::Script
                ((Script *)
                 &script_template.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      cfd::core::Script::Script(&local_a98);
      local_a60._0_1_ = false;
      local_a60._1_1_ = false;
      local_a5e = false;
      local_a58._M_p = local_a48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"");
      local_a38._0_4_ = 0;
      local_a38._4_4_ = 0;
      local_a30 = 0;
      local_a28 = 0xcd00000001;
      local_a20 = 0;
      cfd::core::Script::Script(&local_a18,&exp_script);
      local_9e0 = 0;
      cfd::core::Script::Script(&local_9d8);
      local_9a0 = 0;
      local_99e = 0;
      local_998[0] = local_988;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"");
      local_978 = 0;
      local_970 = 0;
      local_968 = 0xb000000006;
      local_960 = 0x70;
      cfd::core::Script::Script(&local_958);
      local_920 = 0;
      cfd::core::Script::Script(&local_918);
      local_8e0 = 0;
      local_8de = 0;
      local_8d8[0] = local_8c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"");
      local_8b8 = 0;
      local_8b0 = 0;
      local_8a8 = 0xde00000005;
      local_8a0 = 0x92;
      gtest_ar._0_8_ = &local_b50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar,"51","");
      cfd::core::Script::Script(&local_898,(string *)&gtest_ar);
      local_860 = 0;
      cfd::core::Script::Script(&local_858);
      local_820 = 0;
      local_81e = 0;
      local_818[0] = local_808;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"");
      local_7f8 = 0;
      local_7f0 = 0;
      local_7e8 = 0x9900000004;
      local_7e0 = 0x70;
      cfd::core::Script::Script(&local_7d8);
      local_7a0 = 0;
      cfd::core::Script::Script(&local_798);
      local_760 = 0;
      local_75e = 0;
      local_758[0] = local_748;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"");
      local_738 = 0;
      local_730 = 0;
      local_728 = 0xd000000003;
      local_720 = 0xa7;
      cfd::core::Script::Script(&local_718,&exp_script);
      local_6e0 = 0;
      cfd::core::Script::Script(&local_6d8);
      local_6a0 = 0;
      local_69e = 0;
      local_698[0] = local_688;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"");
      local_678 = 0;
      local_670 = 0;
      local_668 = 0x12d00000003;
      local_660 = 0x104;
      cfd::core::Script::Script(&local_658,&TestBody()::multisig_script_abi_cxx11_);
      local_620 = 0;
      cfd::core::Script::Script(&local_618);
      local_5e0 = 0;
      local_5de = 0;
      local_5d8[0] = local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"");
      local_5b8 = 0;
      local_5b0 = 0;
      local_5a8 = 0xbf00000003;
      local_5a0 = 0x96;
      cfd::core::Script::Script(&local_598,&exp_script);
      local_560 = 0;
      cfd::core::Script::Script(&local_558);
      local_520 = 0;
      local_51e = 0;
      local_518[0] = local_508;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p,
                 TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p +
                 TestBody()::scriptsig_template_abi_cxx11_._M_string_length);
      local_4f8 = 0;
      local_4f0 = 0;
      local_4e8 = 0x35c00000004;
      local_4e0 = 0x333;
      cfd::core::Script::Script(&local_4d8);
      local_4a0 = 0xe2;
      cfd::core::Script::Script(&local_498);
      local_460 = 0;
      local_45e = 0;
      local_458[0] = local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"");
      local_438 = 0;
      local_430 = 400;
      local_428 = 0xeb00000004;
      local_420 = 0x70;
      cfd::core::Script::Script(&local_418);
      local_3e0 = 0;
      cfd::core::Script::Script(&local_3d8);
      local_3a0 = 1;
      local_39e = 0;
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
      local_378 = 0;
      local_370 = 0;
      local_368 = 0x213300000004;
      local_360 = 0x2088;
      cfd::core::Script::Script(&local_358);
      local_320 = 0;
      cfd::core::Script::Script(&local_318);
      local_2e0 = 0x101;
      local_2de = 0;
      local_2d8[0] = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
      local_2b8 = 0x2400000000;
      local_2b0 = 0;
      local_2a8 = 0x21b300000004;
      local_2a0 = 0x2108;
      cfd::core::Script::Script(&local_298);
      local_260 = 0;
      cfd::core::Script::Script(&local_258);
      local_220 = 0x101;
      local_21e = 0;
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"");
      local_1f8 = 0x3400000000;
      local_1f0 = 0;
      local_1e8 = 0x112700000004;
      local_1e0 = 0x107c;
      cfd::core::Script::Script(&local_1d8);
      local_1a0 = 0;
      cfd::core::Script::Script(&local_198);
      local_160 = 0x101;
      local_15e = 1;
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
      local_138 = 0x2400000000;
      local_130 = 0;
      local_128 = 0x116700000004;
      local_120 = 0x10bc;
      cfd::core::Script::Script(&local_118);
      local_e0 = 0;
      cfd::core::Script::Script(&local_d8);
      local_a0 = 0x101;
      local_9e = 1;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      local_78 = 0x3400000000;
      local_70 = 0;
      __l._M_len = 0xe;
      __l._M_array = (iterator)&script_template;
      std::
      vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ::vector(&TestBody::test_vector,__l,(allocator_type *)&local_b68);
      lVar3 = 0x9c0;
      do {
        TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector
                  ((TestEstimateConfidentialTxInSizeVector *)
                   ((long)&script_template._vptr_Script + lVar3));
        lVar3 = lVar3 + -0xc0;
      } while (lVar3 != -0xc0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_b50) {
        operator_delete((void *)gtest_ar._0_8_,local_b50._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::
                   vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                   ::~vector,&TestBody::test_vector,&__dso_handle);
      __cxa_guard_release(&TestBody()::test_vector);
    }
  }
  local_b28 = TestBody::test_vector.
              super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::test_vector.
      super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      TestBody::test_vector.
      super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pTVar5 = TestBody::test_vector.
             super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      size = 0;
      wit_size = 0;
      cfd::core::Script::Script(&script_template,&pTVar5->script_template);
      scriptsig_template = (Script *)(pTVar5->script_template)._M_string_length;
      if (scriptsig_template != (Script *)0x0) {
        scriptsig_template = &script_template;
      }
      cache_size = 0;
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          addr_type = pTVar5->addr_type;
          cfd::core::Script::Script(&local_b20,&pTVar5->redeem_script);
          pegin_btc_tx_size = pTVar5->pegin_btc_tx;
          cfd::core::Script::Script(&local_68,&pTVar5->claim_script);
          size = cfd::core::ConfidentialTxIn::EstimateTxInSize
                           (addr_type,&local_b20,pegin_btc_tx_size,&local_68,pTVar5->is_issuance,
                            pTVar5->is_blind,&wit_size,(uint32_t *)0x0,pTVar5->is_reissuance,
                            scriptsig_template,pTVar5->exponent,pTVar5->minimum_bits,&cache_size,
                            pTVar5->txoutproof_size);
          cfd::core::Script::~Script(&local_68);
          cfd::core::Script::~Script(&local_b20);
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x11c,
                   "Expected: (size = ConfidentialTxIn::EstimateTxInSize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, &wit_size, nullptr, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, &cache_size, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=(&local_b68,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_b68);
        if (gtest_ar._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"size","test_data.size",&size,&pTVar5->size);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b68);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x11d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b30,(Message *)&local_b68);
        testing::internal::AssertHelper::~AssertHelper(&local_b30);
        if (local_b68.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b68.data_ + 8))();
          }
          local_b68.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"wit_size","test_data.witness_size",&wit_size,
                 &pTVar5->witness_size);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b68);
        pcVar4 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x11e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b30,(Message *)&local_b68);
        testing::internal::AssertHelper::~AssertHelper(&local_b30);
        if (local_b68.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b68.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b68.data_ + 8))();
          }
          local_b68.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (pTVar5->minimum_bits == 0x34) {
        local_b68.data_._0_4_ = 0x104d;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar,"cache_size","4173",&cache_size,(int *)&local_b68);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b68);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                     ,0x123,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b30,(Message *)&local_b68);
          testing::internal::AssertHelper::~AssertHelper(&local_b30);
          if (local_b68.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_b68.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_b68.data_ + 8))();
            }
            local_b68.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else if (pTVar5->minimum_bits == 0x24) {
        local_b68.data_._0_4_ = 0x100d;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar,"cache_size","4109",&cache_size,(int *)&local_b68);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b68);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                     ,0x121,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b30,(Message *)&local_b68);
          testing::internal::AssertHelper::~AssertHelper(&local_b30);
          if (local_b68.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_b68.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_b68.data_ + 8))();
            }
            local_b68.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      cfd::core::Script::~Script(&script_template);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != local_b28);
  }
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 176, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 222, 146, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 153, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 208, 167, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 301, 260, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 191, 150, exp_script, 0, Script(), false, false, false, scriptsig_template, 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 860, 819, Script(), 226, Script(), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 235, 112, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 8499, 8328, Script(), 0, Script(), true, true, false,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 8627, 8456, Script(), 0, Script(), true, true, false,
        "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, 4391, 4220, Script(), 0, Script(), true, true, true,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 4455, 4284, Script(), 0, Script(), true, true, true,
        "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    uint32_t cache_size = 0;
    EXPECT_NO_THROW((size = ConfidentialTxIn::EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        &wit_size, nullptr, test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, &cache_size,
        test_data.txoutproof_size)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
    if (test_data.minimum_bits == 36) {
      // EXPECT_EQ(cache_size, 2892);
      EXPECT_EQ(cache_size, 4109);
    } else if (test_data.minimum_bits == 52) {
      EXPECT_EQ(cache_size, 4173);
    }
  }
}